

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *pAVar5;
  Arena *arena;
  TestCamelCaseFieldNames *_this;
  TestCamelCaseFieldNames *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestCamelCaseFieldNames *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestCamelCaseFieldNames_const*,proto2_unittest::TestCamelCaseFieldNames*>
                          ((TestCamelCaseFieldNames **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x6c54;
LAB_00a1c092:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedprimitivefield_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedstringfield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[2]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedenumfield_,(RepeatedField<int> *)(from_msg + 4));
  google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessage>::MergeFrom
            (&(local_30->field_0)._impl_.repeatedmessagefield_,
             (RepeatedPtrField<proto2_unittest::ForeignMessage> *)(from_msg + 5));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedstringpiecefield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[6]._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_30->field_0)._impl_.repeatedcordfield_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 8));
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[9]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.stringfield_,(string *)(uVar2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var3 = from_msg[10]._vptr_MessageLite;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.stringpiecefield_,
                 (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
    }
    if ((uVar1 & 4) != 0) {
      uVar2 = from_msg[10]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.cordfield_,(string *)(uVar2 & 0xfffffffffffffffc),
                 pAVar5);
    }
    if ((uVar1 & 8) != 0) {
      from_msg_00 = (MessageLite *)from_msg[0xb]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.messagefield_ != nullptr";
        line = 0x6c6b;
        goto LAB_00a1c092;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0xa0);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessage>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0xa0) = pvVar4;
      }
      else {
        proto2_unittest::ForeignMessage::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      *(int *)((long)&local_30->field_0 + 0xa8) = (int)from_msg[0xb]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x20) != 0) {
      (local_30->field_0)._impl_.enumfield_ =
           *(int *)((long)&from_msg[0xb]._internal_metadata_.ptr_ + 4);
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}